

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O1

void __thiscall dummy_api::set_response_headers(dummy_api *this,response_headers *h)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string_buffer_wrapper wr;
  string_buffer_wrapper local_30;
  
  paVar1 = &local_30.string_.field_2;
  local_30.string_._M_string_length = 0;
  local_30.string_.field_2._M_local_buf[0] = '\0';
  local_30.string_._M_dataplus._M_p = (pointer)paVar1;
  cppcms::impl::response_headers::
  format_cgi_headers<cppcms::impl::response_headers::string_buffer_wrapper>(h,&local_30,true);
  std::__cxx11::string::_M_assign((string *)&this->headers_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_30.string_._M_dataplus._M_p);
  }
  return;
}

Assistant:

virtual void set_response_headers(cppcms::impl::response_headers &h) 
	{
		cppcms::impl::response_headers::string_buffer_wrapper wr;
		h.format_cgi_headers(wr,true);
		headers_ = wr.data();
	}